

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglResizeTests.cpp
# Opt level: O1

void __thiscall
deqp::egl::ResizeTest::ResizeTest(ResizeTest *this,EglTestContext *eglTestCtx,ResizeParams *params)

{
  TestLog *log;
  int i;
  long lVar1;
  string local_40;
  
  TestCase::TestCase(&this->super_TestCase,eglTestCtx,(params->name)._M_dataplus._M_p,
                     (params->description)._M_dataplus._M_p);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ResizeTest_021567f8;
  lVar1 = 0;
  do {
    (this->m_oldSize).m_data[lVar1] = (params->oldSize).m_data[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 == 1);
  lVar1 = 0;
  do {
    (this->m_newSize).m_data[lVar1] = (params->newSize).m_data[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 == 1);
  (this->m_surface).super_UniqueBase<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_>.
  m_data.ptr = (UniqueSurface *)0x0;
  (this->m_context).super_UniqueBase<eglu::UniqueContext,_de::DefaultDeleter<eglu::UniqueContext>_>.
  m_data.ptr = (UniqueContext *)0x0;
  this->m_display = (EGLDisplay)0x0;
  this->m_config = (EGLConfig)0x0;
  (this->m_nativeWindow).
  super_UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>.m_data.ptr =
       (NativeWindow *)0x0;
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  this->m_log = log;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,0x1b32ab9);
  tcu::ResultCollector::ResultCollector(&this->m_status,log,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  glw::Functions::Functions(&this->m_gl);
  return;
}

Assistant:

ResizeTest	(EglTestContext&		eglTestCtx,
											 const ResizeParams&	params)
									: TestCase	(eglTestCtx,
												 params.name.c_str(),
												 params.description.c_str())
									, m_oldSize	(params.oldSize)
									, m_newSize	(params.newSize)
									, m_display	(EGL_NO_DISPLAY)
									, m_config	(DE_NULL)
									, m_log		(m_testCtx.getLog())
									, m_status	(m_log) {}